

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

string<char> * __thiscall
irr::core::string<char>::subString
          (string<char> *__return_storage_ptr__,string<char> *this,u32 begin,s32 length,
          bool make_lower)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  char cVar5;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if ((length < 1) || ((uint)(this->str)._M_string_length <= begin)) {
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    operator=(__return_storage_ptr__,"");
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if ((make_lower) && (sVar2 = (__return_storage_ptr__->str)._M_string_length, sVar2 != 0)) {
      pcVar3 = (__return_storage_ptr__->str)._M_dataplus._M_p;
      sVar4 = 0;
      do {
        cVar1 = pcVar3[sVar4];
        cVar5 = cVar1 + ' ';
        if (0x19 < (int)cVar1 - 0x41U) {
          cVar5 = cVar1;
        }
        pcVar3[sVar4] = cVar5;
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string<T> subString(u32 begin, s32 length, bool make_lower = false) const
	{
		// if start after string
		// or no proper substring length
		if ((length <= 0) || (begin >= size()))
			return string<T>("");

		string<T> o = str.substr(begin, length);
		if (make_lower)
			o.make_lower();
		return o;
	}